

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  undefined4 uVar3;
  int iVar4;
  native_handle_type *pnVar5;
  long *plVar6;
  size_type *psVar7;
  string *psVar8;
  Error error;
  string configFileName;
  string registryFileName;
  string progName;
  undefined1 local_1a0 [8];
  _Alloc_hider local_198;
  undefined1 local_190 [24];
  string local_178;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_150._M_p = (pointer)&local_140;
  local_158._0_4_ = kNone;
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_f0,*argv,(allocator *)local_1a0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  do {
    iVar4 = getopt_long(argc,argv,"hvc:r:",gCommissionerCliOptions,0);
    pcVar2 = _optarg;
    if (iVar4 < 0x72) {
      psVar8 = &local_130;
      if (iVar4 != 99) {
        if (iVar4 == 0x68) {
          if (PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_ == '\0') {
            iVar4 = __cxa_guard_acquire(&PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_);
            if (iVar4 != 0) {
              std::operator+(&local_90,"usage: \nhelp digest:\n    ",&local_f0);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
              psVar7 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_d0.field_2._M_allocated_capacity = *psVar7;
                local_d0.field_2._8_8_ = plVar6[3];
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              }
              else {
                local_d0.field_2._M_allocated_capacity = *psVar7;
                local_d0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_d0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::operator+(&local_70,&local_d0,&local_f0);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
              psVar7 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_b0.field_2._M_allocated_capacity = *psVar7;
                local_b0.field_2._8_8_ = plVar6[3];
                local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              }
              else {
                local_b0.field_2._M_allocated_capacity = *psVar7;
                local_b0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_b0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::operator+(&local_50,&local_b0,&local_f0);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
              psVar7 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_178.field_2._M_allocated_capacity = *psVar7;
                local_178.field_2._8_8_ = plVar6[3];
                local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
              }
              else {
                local_178.field_2._M_allocated_capacity = *psVar7;
                local_178._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_178._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a0,&local_178,&local_f0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a0," [-r|--registry <registryFileName>] [configFileName]");
              if (local_1a0 != (undefined1  [8])local_190) {
                operator_delete((void *)local_1a0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                operator_delete(local_178._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
              __cxa_atexit(std::__cxx11::string::~string,
                           PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_);
            }
          }
          ot::commissioner::Console::Write
                    ((string *)PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_,kWhite);
        }
        else {
LAB_0015ca16:
          if (_optind != argc && local_130._M_string_length == 0) {
            pcVar2 = argv[_optind];
            strlen(pcVar2);
            std::__cxx11::string::_M_replace((ulong)&local_130,0,(char *)0x0,(ulong)pcVar2);
          }
          sigemptyset((sigset_t *)&gSignalSet);
          sigaddset((sigset_t *)&gSignalSet,2);
          pthread_sigmask(0,(__sigset_t *)&gSignalSet,(__sigset_t *)0x0);
          std::thread::thread<void(&)(),,void>((thread *)local_1a0,HandleSignalInterrupt);
          std::thread::detach();
          if (local_1a0 != (undefined1  [8])0x0) {
            std::terminate();
          }
          ot::commissioner::Console::Write(&kLogo_abi_cxx11_,kBlue);
          ot::commissioner::Interpreter::Init
                    ((Error *)local_1a0,&gInterpreter,&local_130,&local_110);
          local_158._0_4_ = local_1a0._0_4_;
          std::__cxx11::string::operator=((string *)&local_150,(string *)&local_198);
          uVar3 = local_158._0_4_;
          if (local_198._M_p != local_190 + 8) {
            operator_delete(local_198._M_p);
          }
          if (uVar3 == kNone) {
            ot::commissioner::Interpreter::Run(&gInterpreter);
          }
        }
LAB_0015cb16:
        if (local_158._0_4_ == kNone) {
          iVar4 = 0;
        }
        else {
          ot::commissioner::Error::ToString_abi_cxx11_(&local_178,(Error *)local_158);
          pnVar5 = (native_handle_type *)
                   std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x2270d3);
          psVar7 = pnVar5 + 2;
          if ((size_type *)*pnVar5 == psVar7) {
            local_190._0_8_ = *psVar7;
            local_190._8_8_ = pnVar5[3];
            local_1a0 = (undefined1  [8])local_190;
          }
          else {
            local_190._0_8_ = *psVar7;
            local_1a0 = (undefined1  [8])*pnVar5;
          }
          local_198._M_p = (pointer)pnVar5[1];
          *pnVar5 = (native_handle_type)psVar7;
          pnVar5[1] = 0;
          *(undefined1 *)(pnVar5 + 2) = 0;
          ot::commissioner::Console::Write((string *)local_1a0,kRed);
          if (local_1a0 != (undefined1  [8])local_190) {
            operator_delete((void *)local_1a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
          }
          iVar4 = -(uint)(local_158._0_4_ != kNone);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p);
        }
        return iVar4;
      }
    }
    else {
      if (iVar4 != 0x72) {
        if (iVar4 != 0x76) goto LAB_0015ca16;
        ot::commissioner::Commissioner::GetVersion_abi_cxx11_();
        ot::commissioner::Console::Write((string *)local_1a0,kWhite);
        if (local_1a0 != (undefined1  [8])local_190) {
          operator_delete((void *)local_1a0);
        }
        goto LAB_0015cb16;
      }
      psVar8 = &local_110;
    }
    pcVar1 = (char *)psVar8->_M_string_length;
    strlen(_optarg);
    std::__cxx11::string::_M_replace((ulong)psVar8,0,pcVar1,(ulong)pcVar2);
  } while( true );
}

Assistant:

int main(int argc, const char *argv[])
{
    using namespace ::ot::commissioner::utils;

    Error error;

    std::string progName = argv[0];
    std::string registryFileName;
    std::string configFileName;

    int  ch;
    bool parseParams = true;

    while (parseParams)
    {
        ch = getopt_long(argc, const_cast<char *const *>(argv), "hvc:r:", gCommissionerCliOptions, nullptr);
        switch (ch)
        {
        case 'h':
            PrintUsage(progName);
            ExitNow();
            break;
        case 'v':
            PrintVersion();
            ExitNow();
            break;
        case 'r':
            registryFileName = optarg;
            break;
        case 'c':
            configFileName = optarg;
            break;
        default:
            parseParams = false;
            break;
        };
    }
    argc -= optind;
    argv += optind;

    if (configFileName.empty())
    {
        // If any option left unprocessed then it must be a config file path
        if (argc != 0)
        {
            configFileName = argv[0];
        }
    }

    // Block signals in this thread and subsequently spawned threads.
    sigemptyset(&gSignalSet);
    sigaddset(&gSignalSet, SIGINT);
    pthread_sigmask(SIG_BLOCK, &gSignalSet, nullptr);

    std::thread(HandleSignalInterrupt).detach();

    Console::Write(kLogo, Console::Color::kBlue);

    SuccessOrExit(error = gInterpreter.Init(configFileName, registryFileName));

    gInterpreter.Run();

exit:
    if (error != ErrorCode::kNone)
    {
        Console::Write("start OT-commissioner CLI failed: " + error.ToString(), Console::Color::kRed);
    }
    return error == ErrorCode::kNone ? 0 : -1;
}